

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<char_const(&)[3],std::__cxx11::string,char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
          (CompilerGLSL *this,char (*t) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char **ts_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,char (*ts_3) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [3])

{
  StringStream<4096UL,_4096UL>::operator<<(&this->buffer,*t);
  this->statement_count = this->statement_count + 1;
  statement_inner<std::__cxx11::string,char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
            (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}